

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.h
# Opt level: O1

void __thiscall
slang::ast::AssertionInstanceExpression::visitExprs<slang::ast::DistVarVisitor&>
          (AssertionInstanceExpression *this,DistVarVisitor *visitor)

{
  size_t sVar1;
  pointer ppSVar2;
  DeclaredType *this_00;
  Expression *this_01;
  long lVar3;
  
  sVar1 = (this->localVars)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppSVar2 = (this->localVars)._M_ptr;
    lVar3 = 0;
    do {
      this_00 = Symbol::getDeclaredType(*(Symbol **)((long)ppSVar2 + lVar3));
      this_01 = DeclaredType::getInitializer(this_00);
      if (this_01 != (Expression *)0x0) {
        Expression::visitExpression<slang::ast::Expression_const,slang::ast::DistVarVisitor&>
                  (this_01,this_01,visitor);
      }
      lVar3 = lVar3 + 8;
    } while (sVar1 << 3 != lVar3);
  }
  return;
}

Assistant:

void serializeTo(ASTSerializer&) const {}